

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int __thiscall CVmObjList::sub_val(CVmObjList *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  vm_obj_id_t in_EDX;
  vm_val_t self_val;
  vm_val_t *in_stack_00000038;
  vm_val_t *in_stack_00000040;
  vm_val_t local_30 [3];
  
  vm_val_t::set_obj(local_30,in_EDX);
  sub_from_list(in_stack_00000040,in_stack_00000038,(char *)this,result);
  return 1;
}

Assistant:

int CVmObjList::sub_val(VMG_ vm_val_t *result,
                        vm_obj_id_t self, const vm_val_t *val)
{
    vm_val_t self_val;
    
    /* 
     *   Invoke our static list subtraction routine, using our extension
     *   as the constant list.  Our extension is stored in the same format
     *   as a constant list, so we can use the same code to handle
     *   subtraction from a list object as we would for subtraction from a
     *   constant list. 
     */
    self_val.set_obj(self);
    sub_from_list(vmg_ result, &self_val, ext_, val);

    /* handled */
    return TRUE;
    
}